

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChLoadsBody.cpp
# Opt level: O1

void __thiscall
chrono::ChLoadBodyInertia::LoadIntLoadResidual_Mv
          (ChLoadBodyInertia *this,ChVectorDynamic<> *R,ChVectorDynamic<> *w,double c)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  element_type *peVar11;
  int iVar12;
  uint uVar13;
  double *pdVar14;
  Index index;
  ulong uVar15;
  char *__function;
  ulong uVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  ChVector<double> a_x;
  ChVector<double> a_w;
  ChVector<double> local_90;
  double *local_78;
  double dStack_70;
  double local_68;
  ChVectorDynamic<> *local_60;
  ulong local_58;
  long local_48;
  ChVector<double> local_38;
  
  if ((this->super_ChLoadCustom).super_ChLoadBase.jacobians == (ChLoadJacobians *)0x0) {
    return;
  }
  peVar11 = (this->super_ChLoadCustom).loadable.
            super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  iVar12 = (*peVar11->_vptr_ChLoadable[0xb])(peVar11,0);
  if ((char)iVar12 == '\0') {
    return;
  }
  peVar11 = (this->super_ChLoadCustom).loadable.
            super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  uVar13 = (*peVar11->_vptr_ChLoadable[9])(peVar11,0);
  local_58 = (ulong)uVar13;
  local_78 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data +
             local_58;
  local_48 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
  dStack_70 = 1.48219693752374e-323;
  if ((long)local_58 <= local_48 + -3) {
    local_60 = w;
    ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
              (&local_90,
               (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                *)&local_78,(type *)0x0);
    peVar11 = (this->super_ChLoadCustom).loadable.
              super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    iVar12 = (*peVar11->_vptr_ChLoadable[9])(peVar11,0);
    local_58 = (ulong)(iVar12 + 3);
    local_78 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
               + local_58;
    local_48 = (w->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows;
    dStack_70 = 1.48219693752374e-323;
    if ((long)local_58 <= local_48 + -3) {
      local_60 = w;
      ChVector<double>::ChVector<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>const,_1,1,false>>
                (&local_38,
                 (MatrixBase<Eigen::Block<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_>
                  *)&local_78,(type *)0x0);
      local_68 = this->mass;
      auVar17._8_8_ = 0;
      auVar17._0_8_ = local_38.m_data[0];
      auVar19._8_8_ = 0;
      auVar19._0_8_ = local_38.m_data[1];
      dVar1 = (this->c_m).m_data[2];
      auVar24._8_8_ = 0;
      auVar24._0_8_ = dVar1;
      auVar28._8_8_ = 0;
      auVar28._0_8_ = local_38.m_data[2];
      dVar2 = (this->c_m).m_data[0];
      auVar31._8_8_ = 0;
      auVar31._0_8_ = dVar2;
      dVar3 = (this->c_m).m_data[1];
      auVar35._8_8_ = 0;
      auVar35._0_8_ = dVar3;
      auVar38._8_8_ = 0;
      auVar38._0_8_ = dVar3 * local_38.m_data[2];
      auVar19 = vfmsub231sd_fma(auVar38,auVar19,auVar24);
      auVar25._8_8_ = 0;
      auVar25._0_8_ = dVar1 * local_38.m_data[0];
      auVar24 = vfmsub231sd_fma(auVar25,auVar31,auVar28);
      auVar20._8_8_ = 0;
      auVar20._0_8_ = dVar2 * local_38.m_data[1];
      auVar17 = vfmsub231sd_fma(auVar20,auVar17,auVar35);
      local_78 = (double *)(local_68 * (auVar19._0_8_ + local_90.m_data[0]));
      dStack_70 = local_68 * (auVar24._0_8_ + local_90.m_data[1]);
      local_68 = local_68 * (auVar17._0_8_ + local_90.m_data[2]);
      peVar11 = (this->super_ChLoadCustom).loadable.
                super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      uVar13 = (*peVar11->_vptr_ChLoadable[9])(peVar11,0);
      if ((long)(ulong)uVar13 <=
          (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows + -3)
      {
        pdVar14 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                  m_data + uVar13;
        uVar15 = 3;
        if ((((ulong)pdVar14 & 7) == 0) &&
           (uVar16 = (ulong)(-((uint)((ulong)pdVar14 >> 3) & 0x1fffffff) & 7), uVar16 < 3)) {
          uVar15 = uVar16;
        }
        if (uVar15 != 0) {
          uVar16 = 0;
          do {
            pdVar14[uVar16] = c * (double)(&local_78)[uVar16] + pdVar14[uVar16];
            uVar16 = uVar16 + 1;
          } while (uVar15 != uVar16);
        }
        if (uVar15 < 3) {
          do {
            pdVar14[uVar15] = c * (double)(&local_78)[uVar15] + pdVar14[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar15 != 3);
        }
        dVar1 = this->mass;
        dVar2 = (this->c_m).m_data[0];
        auVar18._8_8_ = 0;
        auVar18._0_8_ = dVar2;
        dVar3 = (this->c_m).m_data[1];
        auVar21._8_8_ = 0;
        auVar21._0_8_ = dVar3;
        auVar26._8_8_ = 0;
        auVar26._0_8_ = local_90.m_data[2];
        dVar4 = (this->c_m).m_data[2];
        auVar29._8_8_ = 0;
        auVar29._0_8_ = dVar4;
        auVar32._8_8_ = 0;
        auVar32._0_8_ = local_90.m_data[0];
        auVar36._8_8_ = 0;
        auVar36._0_8_ = local_90.m_data[1];
        auVar39._8_8_ = 0;
        auVar39._0_8_ = local_90.m_data[1] * dVar4;
        auVar24 = vfmsub231sd_fma(auVar39,auVar21,auVar26);
        auVar27._8_8_ = 0;
        auVar27._0_8_ = local_90.m_data[2] * dVar2;
        auVar17 = vfmsub231sd_fma(auVar27,auVar32,auVar29);
        auVar22._8_8_ = 0;
        auVar22._0_8_ = local_90.m_data[0] * dVar3;
        auVar20 = vfmsub231sd_fma(auVar22,auVar18,auVar36);
        auVar23._8_8_ = 0;
        auVar23._0_8_ = local_38.m_data[0];
        auVar5._8_8_ = 0;
        auVar5._0_8_ = (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[0];
        auVar33._8_8_ = 0;
        auVar33._0_8_ =
             local_38.m_data[1] *
             (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[1];
        auVar19 = vfmadd231sd_fma(auVar33,auVar23,auVar5);
        auVar37._8_8_ = 0;
        auVar37._0_8_ = local_38.m_data[2];
        auVar6._8_8_ = 0;
        auVar6._0_8_ = (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[2];
        auVar19 = vfmadd231sd_fma(auVar19,auVar37,auVar6);
        local_78 = (double *)(dVar1 * auVar24._0_8_ + auVar19._0_8_);
        auVar7._8_8_ = 0;
        auVar7._0_8_ = (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[3];
        auVar34._8_8_ = 0;
        auVar34._0_8_ =
             local_38.m_data[1] *
             (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[4];
        auVar19 = vfmadd231sd_fma(auVar34,auVar23,auVar7);
        auVar8._8_8_ = 0;
        auVar8._0_8_ = (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[5];
        auVar19 = vfmadd231sd_fma(auVar19,auVar37,auVar8);
        dStack_70 = dVar1 * auVar17._0_8_ + auVar19._0_8_;
        auVar9._8_8_ = 0;
        auVar9._0_8_ = (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
                       super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data
                       .array[6];
        auVar30._8_8_ = 0;
        auVar30._0_8_ =
             local_38.m_data[1] *
             (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[7];
        auVar19 = vfmadd231sd_fma(auVar30,auVar23,auVar9);
        auVar10._8_8_ = 0;
        auVar10._0_8_ =
             (this->I).super_Matrix<double,_3,_3,_1,_3,_3>.
             super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_1,_3,_3>_>.m_storage.m_data.array[8];
        auVar19 = vfmadd231sd_fma(auVar19,auVar37,auVar10);
        local_68 = dVar1 * auVar20._0_8_ + auVar19._0_8_;
        peVar11 = (this->super_ChLoadCustom).loadable.
                  super___shared_ptr<chrono::ChLoadable,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        iVar12 = (*peVar11->_vptr_ChLoadable[9])(peVar11,0);
        if ((long)(ulong)(iVar12 + 3) <=
            (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows +
            -3) {
          pdVar14 = (R->super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>).m_storage.
                    m_data + (iVar12 + 3);
          uVar15 = 3;
          if ((((ulong)pdVar14 & 7) == 0) &&
             (uVar16 = (ulong)(-((uint)((ulong)pdVar14 >> 3) & 0x1fffffff) & 7), uVar16 < 3)) {
            uVar15 = uVar16;
          }
          if (uVar15 != 0) {
            uVar16 = 0;
            do {
              pdVar14[uVar16] = c * (double)(&local_78)[uVar16] + pdVar14[uVar16];
              uVar16 = uVar16 + 1;
            } while (uVar15 != uVar16);
          }
          if (2 < uVar15) {
            return;
          }
          do {
            pdVar14[uVar15] = c * (double)(&local_78)[uVar15] + pdVar14[uVar15];
            uVar15 = uVar15 + 1;
          } while (uVar15 != 3);
          return;
        }
      }
      __function = 
      "Eigen::Block<Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
      ;
      goto LAB_005d983a;
    }
  }
  dStack_70 = 1.48219693752374e-323;
  __function = 
  "Eigen::Block<const Eigen::Matrix<double, -1, 1>, -1, 1>::Block(XprType &, Index, Index, Index, Index) [XprType = const Eigen::Matrix<double, -1, 1>, BlockRows = -1, BlockCols = 1, InnerPanel = false]"
  ;
  local_60 = w;
LAB_005d983a:
  __assert_fail("startRow >= 0 && blockRows >= 0 && startRow <= xpr.rows() - blockRows && startCol >= 0 && blockCols >= 0 && startCol <= xpr.cols() - blockCols"
                ,"/usr/include/eigen3/Eigen/src/Core/Block.h",0x93,__function);
}

Assistant:

void ChLoadBodyInertia::LoadIntLoadResidual_Mv(ChVectorDynamic<>& R, const ChVectorDynamic<>& w, const double c) {
    if (!this->jacobians)
        return;

    if (!loadable->IsSubBlockActive(0))
        return;

    // fetch w as a contiguous vector
    ChVector<> a_x = w.segment(loadable->GetSubBlockOffset(0), 3);
    ChVector<> a_w = w.segment(loadable->GetSubBlockOffset(0)+3, 3);

    // R+=c*M*a  
    R.segment(loadable->GetSubBlockOffset(0), 3)   += c * (this->mass * (a_x + chrono::Vcross(a_w, this->c_m))).eigen();
    R.segment(loadable->GetSubBlockOffset(0)+3, 3) += c * (this->mass * chrono::Vcross(this->c_m, a_x) + this->I * a_w).eigen();
}